

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

void * add_to_tmp_buffer(AttrBuffer buf,uint size)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  int in_ESI;
  long *in_RDI;
  int tmp_size;
  int old_size;
  uint local_18;
  
  iVar1 = *(int *)((long)in_RDI + 0xc);
  uVar2 = iVar1 + in_ESI;
  if ((int)in_RDI[1] == 0) {
    local_18 = uVar2;
    if (uVar2 < 0x80) {
      local_18 = 0x80;
    }
    pvVar3 = malloc((long)(int)local_18);
    *in_RDI = (long)pvVar3;
    if (*in_RDI != 0) {
      memset((void *)*in_RDI,0,(long)(int)local_18);
    }
  }
  if ((long)(int)in_RDI[1] < (long)(ulong)uVar2) {
    pvVar3 = realloc((void *)*in_RDI,(ulong)uVar2);
    *in_RDI = (long)pvVar3;
    memset((void *)(*in_RDI + (long)(int)in_RDI[1]),0,(ulong)(uVar2 - (int)in_RDI[1]));
    *(uint *)(in_RDI + 1) = uVar2;
  }
  if (*in_RDI == 0) {
    *(undefined4 *)(in_RDI + 1) = 0;
  }
  else {
    *(uint *)((long)in_RDI + 0xc) = uVar2;
  }
  return (void *)(*in_RDI + (long)iVar1);
}

Assistant:

static
void *
add_to_tmp_buffer(AttrBuffer buf, unsigned int size)
{
    int old_size = buf->tmp_buffer_in_use_size;
    size += old_size;

    if (buf->tmp_buffer_size == 0) {
	int tmp_size = Max(size, TMP_BUFFER_INIT_SIZE);
	buf->tmp_buffer = malloc(tmp_size * sizeof(char));
	if(buf->tmp_buffer) memset(buf->tmp_buffer, 0, tmp_size * sizeof(char));
    }
    if ((long)size > (long)buf->tmp_buffer_size) {
	buf->tmp_buffer = realloc(buf->tmp_buffer, size);
	memset (((char*)buf->tmp_buffer) + buf->tmp_buffer_size, 0, size - buf->tmp_buffer_size);
	buf->tmp_buffer_size = size;
    }
    if (!buf->tmp_buffer) {
	buf->tmp_buffer_size = 0;
    } else {
	buf->tmp_buffer_in_use_size = size;
    }

    return old_size + (char*)buf->tmp_buffer;
}